

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O1

void __thiscall
optimization::graph_color::Conflict_Map::add_conflict
          (Conflict_Map *this,VarId *defVar,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *useVars)

{
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_01;
  _Base_ptr p_Var3;
  size_type sVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *p_Var7;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  bool bVar11;
  VarId useVar;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_a8;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *local_70;
  key_type local_68;
  Conflict_Map *local_58;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  this_00 = &this->merged_var_Map;
  sVar4 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count(this_00,defVar);
  if (sVar4 != 0) {
    pmVar5 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::at(this_00,defVar);
    defVar->id = pmVar5->id;
  }
  sVar6 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(&this->static_Map,defVar);
  if (sVar6 == 0) {
    p_Var1 = &local_a8._M_impl.super__Rb_tree_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl._0_8_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var7 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](&this->static_Map,defVar)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::clear(p_Var7);
    if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_color =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_parent =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_left =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_right =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(p_Var7->_M_impl).super__Rb_tree_header._M_header;
      (p_Var7->_M_impl).super__Rb_tree_header._M_node_count =
           local_a8._M_impl.super__Rb_tree_header._M_node_count;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_a8);
    local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a8._M_impl._0_8_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var7 = &std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::operator[](&this->dynamic_Map,defVar)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::clear(p_Var7);
    if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_color =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_parent =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_left =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
      (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_right =
           local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(p_Var7->_M_impl).super__Rb_tree_header._M_header;
      (p_Var7->_M_impl).super__Rb_tree_header._M_node_count =
           local_a8._M_impl.super__Rb_tree_header._M_node_count;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_a8);
  }
  local_38 = (useVars->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(useVars->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (local_38 != local_40) {
    p_Var1 = &(this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header;
    local_48 = &(this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = &this->dynamic_Map;
    local_58 = this;
    local_50 = this_00;
    do {
      p_Var3 = local_48;
      local_68.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
      local_68.id = *(uint32_t *)&local_38[1]._M_parent;
      p_Var10 = (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var9 = &p_Var1->_M_header;
      for (; p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[bVar11]) {
        bVar11 = *(uint *)&p_Var10[1]._M_parent < local_68.id;
        if (!bVar11) {
          p_Var9 = p_Var10;
        }
      }
      p_Var10 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
         (p_Var10 = p_Var9, local_68.id < *(uint *)&p_Var9[1]._M_parent)) {
        p_Var10 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var10 != p_Var1) {
        pmVar5 = std::
                 map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                 ::at(local_50,&local_68);
        local_68.id = pmVar5->id;
      }
      if ((local_68.id == 0x1020d && defVar->id == 0x1020b) ||
         (defVar->id == 0x1020d && local_68.id == 0x1020b)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"find it ",8);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
      }
      if (defVar->id != local_68.id) {
        p_Var9 = p_Var3;
        for (p_Var10 = (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var10 != (_Base_ptr)0x0; p_Var10 = (&p_Var10->_M_left)[bVar11]) {
          bVar11 = *(uint *)&p_Var10[1]._M_parent < local_68.id;
          if (!bVar11) {
            p_Var9 = p_Var10;
          }
        }
        p_Var10 = p_Var3;
        if ((p_Var9 != p_Var3) && (p_Var10 = p_Var9, local_68.id < *(uint *)&p_Var9[1]._M_parent)) {
          p_Var10 = p_Var3;
        }
        if (p_Var10 == p_Var3) {
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl._0_8_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_a8._M_impl.super__Rb_tree_header._M_header;
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
               local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var7 = &std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](&this->static_Map,&local_68)->_M_t;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::clear(p_Var7);
          p_Var2 = &local_a8._M_impl.super__Rb_tree_header;
          if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_color =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_parent =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_left =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_right =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &(p_Var7->_M_impl).super__Rb_tree_header._M_header;
            (p_Var7->_M_impl).super__Rb_tree_header._M_node_count =
                 local_a8._M_impl.super__Rb_tree_header._M_node_count;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          }
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_a8);
          local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_a8._M_impl._0_8_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
          local_a8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
          p_Var7 = &std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](local_70,&local_68)->_M_t;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::clear(p_Var7);
          if (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_color =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_color;
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_parent =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_parent;
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_left =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
            (p_Var7->_M_impl).super__Rb_tree_header._M_header._M_right =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_a8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &(p_Var7->_M_impl).super__Rb_tree_header._M_header;
            (p_Var7->_M_impl).super__Rb_tree_header._M_node_count =
                 local_a8._M_impl.super__Rb_tree_header._M_node_count;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_a8._M_impl.super__Rb_tree_header._M_header;
            local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree(&local_a8);
          this = local_58;
        }
        p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](&this->static_Map,defVar);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,&local_68);
        p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](&this->static_Map,&local_68);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,defVar);
        this_01 = local_70;
        p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](local_70,defVar);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,&local_68);
        p_Var8 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](this_01,&local_68);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var8,defVar);
      }
      local_38 = (_Base_ptr)std::_Rb_tree_increment(local_38);
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void add_conflict(mir::inst::VarId defVar,
                    std::set<mir::inst::VarId> useVars) {
    if (merged_var_Map.count(defVar)) {
      defVar = merged_var_Map.at(defVar);
    }
    if (!static_Map.count(defVar)) {
      static_Map[defVar] = std::set<mir::inst::VarId>();
      dynamic_Map[defVar] = std::set<mir::inst::VarId>();
    }
    for (auto useVar : useVars) {
      if (merged_var_Map.count(useVar)) {
        useVar = merged_var_Map.at(useVar);
      }
      if (defVar.id == 66059 && useVar.id == 66061 ||
          useVar.id == 66059 && defVar.id == 66061) {
        std::cout << "find it " << std::endl;
      }
      if (defVar == useVar) {
        continue;
      }
      if (!static_Map.count(useVar)) {
        static_Map[useVar] = std::set<mir::inst::VarId>();
        dynamic_Map[useVar] = std::set<mir::inst::VarId>();
      }
      static_Map[defVar].insert(useVar);
      static_Map[useVar].insert(defVar);
      dynamic_Map[defVar].insert(useVar);
      dynamic_Map[useVar].insert(defVar);
    }
  }